

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

Try<int> * __thiscall
async_simple::coro::detail::LazyAwaiterBase<async_simple::Try<int>_>::awaitResume
          (Try<int> *__return_storage_ptr__,LazyAwaiterBase<async_simple::Try<int>_> *this)

{
  Try<int> *pTVar1;
  _Variant_storage<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr> _Stack_28;
  anon_class_8_1_a78179b7 local_18;
  
  pTVar1 = LazyPromise<async_simple::Try<int>_>::result
                     ((LazyPromise<async_simple::Try<int>_> *)
                      ((long)(this->_handle).__handle_ + 0x10));
  _Stack_28._M_index =
       *(__index_type *)
        ((long)&(pTVar1->_value).
                super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>
        + 8);
  local_18.__lhs =
       (_Move_ctor_base<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr> *)
       &_Stack_28;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::monostate,_int,_std::__exception_ptr::exception_ptr>_&&>
    ::_S_vtable._M_arr[(long)(char)_Stack_28._M_index + 1]._M_data)(&local_18,&pTVar1->_value);
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr>::_Move_ctor_base
            ((_Move_ctor_base<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr> *)
             __return_storage_ptr__,
             (_Move_ctor_base<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr> *)
             &_Stack_28);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_int,_std::__exception_ptr::exception_ptr>::
  ~_Variant_storage(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }